

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void host_upload_texture(Host *host,HostTexture *texture,int w,int h,void *data)

{
  GLTextureFormat GVar1;
  
  if (texture->width < w) {
    __assert_fail("w <= texture->width",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                  0x24a,"void host_upload_texture(Host *, HostTexture *, int, int, const void *)");
  }
  if (h <= texture->height) {
    glBindTexture(0xde1,(int)texture->handle);
    GVar1 = host_apply_texture_format(texture->format);
    glTexSubImage2D(0xde1,0,0,0,w,h,GVar1._0_8_ >> 0x20,0x1401,data);
    return;
  }
  __assert_fail("h <= texture->height",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x24b,
                "void host_upload_texture(Host *, HostTexture *, int, int, const void *)");
}

Assistant:

void host_upload_texture(Host* host, HostTexture* texture, int w, int h,
                         const void* data) {
  assert(w <= texture->width);
  assert(h <= texture->height);
  glBindTexture(GL_TEXTURE_2D, texture->handle);
  GLTextureFormat gl_format = host_apply_texture_format(texture->format);
  glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, w, h, gl_format.format,
                  gl_format.type, data);
}